

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptGeneratorFunction.cpp
# Opt level: O1

JavascriptGeneratorFunction *
Js::JavascriptGeneratorFunction::OP_NewScGenFunc
          (FrameDisplay *environment,FunctionInfoPtrPtr infoRef)

{
  bool bVar1;
  FunctionProxy *this;
  ThreadContext *pTVar2;
  FunctionInfo *pFVar3;
  JavascriptLibrary *this_00;
  code *pcVar4;
  bool bVar5;
  ScriptContext *scriptContext;
  GeneratorVirtualScriptFunction *scriptFunction;
  undefined4 *puVar6;
  JavascriptGeneratorFunction *pJVar7;
  JavascriptMethod entryPoint;
  Type *addr;
  
  this = (infoRef->ptr->functionBodyImpl).ptr;
  scriptContext = FunctionProxy::GetScriptContext(this);
  pTVar2 = scriptContext->threadContext;
  bVar1 = pTVar2->noJsReentrancy;
  pTVar2->noJsReentrancy = true;
  scriptFunction =
       JavascriptLibrary::CreateGeneratorVirtualScriptFunction
                 ((scriptContext->super_ScriptContextBase).javascriptLibrary,this);
  ScriptFunction::SetEnvironment(&scriptFunction->super_ScriptFunction,environment);
  if ((this->functionInfo).ptr == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4ea,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar5) goto LAB_00bde411;
    *puVar6 = 0;
  }
  if ((((this->functionInfo).ptr)->functionBodyImpl).ptr != this) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4eb,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                "GetFunctionInfo()->GetFunctionProxy() == this");
    if (!bVar5) goto LAB_00bde411;
    *puVar6 = 0;
  }
  pFVar3 = (this->functionInfo).ptr;
  if ((pFVar3->attributes & Async) != None) {
    if (pFVar3 == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                  ,0x57d,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar5) goto LAB_00bde411;
      *puVar6 = 0;
    }
    if ((((this->functionInfo).ptr)->functionBodyImpl).ptr != this) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                  ,0x57e,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                  "GetFunctionInfo()->GetFunctionProxy() == this");
      if (!bVar5) goto LAB_00bde411;
      *puVar6 = 0;
    }
    pFVar3 = (this->functionInfo).ptr;
    if ((pFVar3->attributes & Module) == None) {
      if (pFVar3 == (FunctionInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                    ,0x4ff,"(GetFunctionInfo())","GetFunctionInfo()");
        if (!bVar5) goto LAB_00bde411;
        *puVar6 = 0;
      }
      if ((((this->functionInfo).ptr)->functionBodyImpl).ptr != this) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                    ,0x500,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                    "GetFunctionInfo()->GetFunctionProxy() == this");
        if (!bVar5) {
LAB_00bde411:
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        *puVar6 = 0;
      }
      if ((((this->functionInfo).ptr)->attributes & Generator) == None) {
        pJVar7 = &JavascriptAsyncFunction::New(scriptContext,scriptFunction)->
                  super_JavascriptGeneratorFunction;
      }
      else {
        pJVar7 = &JavascriptAsyncGeneratorFunction::New(scriptContext,scriptFunction)->
                  super_JavascriptGeneratorFunction;
      }
      goto LAB_00bde3ce;
    }
  }
  this_00 = (scriptContext->super_ScriptContextBase).javascriptLibrary;
  entryPoint = FunctionInfo::GetOriginalEntryPoint(&functionInfo);
  pJVar7 = JavascriptLibrary::CreateGeneratorFunction(this_00,entryPoint,scriptFunction);
LAB_00bde3ce:
  addr = &scriptFunction->realFunction;
  Memory::Recycler::WBSetBit((char *)addr);
  addr->ptr = pJVar7;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  pTVar2->noJsReentrancy = bVar1;
  return pJVar7;
}

Assistant:

JavascriptGeneratorFunction* JavascriptGeneratorFunction::OP_NewScGenFunc(FrameDisplay *environment, FunctionInfoPtrPtr infoRef)
    {
        FunctionProxy* functionProxy = (*infoRef)->GetFunctionProxy();
        ScriptContext* scriptContext = functionProxy->GetScriptContext();
        JIT_HELPER_NOT_REENTRANT_HEADER(ScrFunc_OP_NewScGenFunc, reentrancylock, scriptContext->GetThreadContext());

        GeneratorVirtualScriptFunction* scriptFunction = scriptContext->GetLibrary()->CreateGeneratorVirtualScriptFunction(functionProxy);
        scriptFunction->SetEnvironment(environment);

        JS_ETW(EventWriteJSCRIPT_RECYCLER_ALLOCATE_FUNCTION(scriptFunction, EtwTrace::GetFunctionId(functionProxy)));

        JavascriptGeneratorFunction* genFunc = nullptr;
        if (functionProxy->IsAsync() && !functionProxy->IsModule())
        {
            if (functionProxy->IsGenerator())
            {
                genFunc = JavascriptAsyncGeneratorFunction::New(scriptContext, scriptFunction);
            }
            else
            {
                genFunc = JavascriptAsyncFunction::New(scriptContext, scriptFunction);
            }
        }
        else
        {
            genFunc = JavascriptGeneratorFunction::New(scriptContext, scriptFunction);
        }

        scriptFunction->SetRealGeneratorFunction(genFunc);

        return genFunc;
        JIT_HELPER_END(ScrFunc_OP_NewScGenFunc);
    }